

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed_info.c
# Opt level: O0

void read_feed_info(feed_info_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  int local_2c;
  int i;
  char **field_values_local;
  char **field_names_local;
  int field_count_local;
  feed_info_t *record_local;
  
  init_feed_info(record);
  for (local_2c = 0; local_2c < field_count; local_2c = local_2c + 1) {
    iVar1 = strcmp(field_names[local_2c],"feed_publisher_name");
    if (iVar1 == 0) {
      strcpy(record->feed_publisher_name,field_values[local_2c]);
    }
    else {
      iVar1 = strcmp(field_names[local_2c],"feed_publisher_url");
      if (iVar1 == 0) {
        strcpy(record->feed_publisher_url,field_values[local_2c]);
      }
      else {
        iVar1 = strcmp(field_names[local_2c],"feed_lang");
        if (iVar1 == 0) {
          strcpy(record->feed_lang,field_values[local_2c]);
        }
        else {
          iVar1 = strcmp(field_names[local_2c],"feed_start_date");
          if (iVar1 == 0) {
            strcpy(record->feed_start_date,field_values[local_2c]);
          }
          else {
            iVar1 = strcmp(field_names[local_2c],"feed_end_date");
            if (iVar1 == 0) {
              strcpy(record->feed_end_date,field_values[local_2c]);
            }
            else {
              iVar1 = strcmp(field_names[local_2c],"feed_version");
              if (iVar1 == 0) {
                strcpy(record->feed_version,field_values[local_2c]);
              }
              else {
                iVar1 = strcmp(field_names[local_2c],"feed_contact_email");
                if (iVar1 == 0) {
                  strcpy(record->feed_contact_email,field_values[local_2c]);
                }
                else {
                  iVar1 = strcmp(field_names[local_2c],"feed_contact_url");
                  if (iVar1 == 0) {
                    strcpy(record->feed_contact_url,field_values[local_2c]);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void read_feed_info(feed_info_t *record, int field_count, const char **field_names, const char **field_values) {
    init_feed_info(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "feed_publisher_name") == 0) {
            strcpy(record->feed_publisher_name, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "feed_publisher_url") == 0) {
            strcpy(record->feed_publisher_url, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "feed_lang") == 0) {
            strcpy(record->feed_lang, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "feed_start_date") == 0) {
            strcpy(record->feed_start_date, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "feed_end_date") == 0) {
            strcpy(record->feed_end_date, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "feed_version") == 0) {
            strcpy(record->feed_version, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "feed_contact_email") == 0) {
            strcpy(record->feed_contact_email, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "feed_contact_url") == 0) {
            strcpy(record->feed_contact_url, field_values[i]);
            continue;
        }
    }
}